

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O0

void __thiscall
QPDFAcroFormDocumentHelper::adjustInheritedFields
          (QPDFAcroFormDocumentHelper *this,QPDFObjectHandle *obj,bool override_da,
          string *from_default_da,bool override_q,int from_default_q)

{
  bool bVar1;
  byte local_1a1;
  byte local_181;
  QPDFObjectHandle local_170;
  allocator<char> local_159;
  string local_158;
  int local_138;
  byte local_133;
  byte local_132;
  allocator<char> local_131;
  int q;
  QPDFObjectHandle local_110;
  allocator<char> local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  string da;
  string local_b0;
  QPDFObjectHandle local_80;
  undefined1 local_70 [8];
  QPDFFormFieldObjectHelper cur_field;
  anon_class_1_0_00000001 has_explicit;
  int from_default_q_local;
  bool override_q_local;
  string *from_default_da_local;
  bool override_da_local;
  QPDFObjectHandle *obj_local;
  QPDFAcroFormDocumentHelper *this_local;
  
  if ((override_da) || (override_q)) {
    QPDFObjectHandle::QPDFObjectHandle(&local_80,obj);
    QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
              ((QPDFFormFieldObjectHelper *)local_70,&local_80);
    QPDFObjectHandle::~QPDFObjectHandle(&local_80);
    da.field_2._M_local_buf[0xe] = '\0';
    da.field_2._M_local_buf[0xd] = '\0';
    local_181 = 0;
    if (override_da) {
      std::allocator<char>::allocator();
      da.field_2._M_local_buf[0xe] = '\x01';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"/DA",(allocator<char> *)(da.field_2._M_local_buf + 0xf));
      da.field_2._M_local_buf[0xd] = '\x01';
      bVar1 = adjustInheritedFields::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)
                         ((long)&cur_field.m.
                                 super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 7),(QPDFFormFieldObjectHelper *)local_70,
                         &local_b0);
      local_181 = bVar1 ^ 0xff;
    }
    if ((da.field_2._M_local_buf[0xd] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&local_b0);
    }
    if ((da.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)(da.field_2._M_local_buf + 0xf));
    }
    if ((local_181 & 1) != 0) {
      QPDFFormFieldObjectHelper::getDefaultAppearance_abi_cxx11_
                ((string *)local_d8,(QPDFFormFieldObjectHelper *)local_70);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_d8,from_default_da);
      if (bVar1) {
        QTC::TC("qpdf","QPDFAcroFormDocumentHelper override da",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"/DA",&local_f9);
        QPDFObjectHandle::newUnicodeString(&local_110,from_default_da);
        QPDFObjectHandle::replaceKey(obj,&local_f8,&local_110);
        QPDFObjectHandle::~QPDFObjectHandle(&local_110);
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator(&local_f9);
      }
      std::__cxx11::string::~string((string *)local_d8);
    }
    local_132 = 0;
    local_133 = 0;
    local_1a1 = 0;
    if (override_q) {
      std::allocator<char>::allocator();
      local_132 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&q,"/Q",&local_131);
      local_133 = 1;
      bVar1 = adjustInheritedFields::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)
                         ((long)&cur_field.m.
                                 super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 7),(QPDFFormFieldObjectHelper *)local_70,
                         (string *)&q);
      local_1a1 = bVar1 ^ 0xff;
    }
    if ((local_133 & 1) != 0) {
      std::__cxx11::string::~string((string *)&q);
    }
    if ((local_132 & 1) != 0) {
      std::allocator<char>::~allocator(&local_131);
    }
    if (((local_1a1 & 1) != 0) &&
       (local_138 = QPDFFormFieldObjectHelper::getQuadding((QPDFFormFieldObjectHelper *)local_70),
       local_138 != from_default_q)) {
      QTC::TC("qpdf","QPDFAcroFormDocumentHelper override q",0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"/Q",&local_159);
      QPDFObjectHandle::newInteger(&local_170,(long)from_default_q);
      QPDFObjectHandle::replaceKey(obj,&local_158,&local_170);
      QPDFObjectHandle::~QPDFObjectHandle(&local_170);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator(&local_159);
    }
    QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper((QPDFFormFieldObjectHelper *)local_70);
  }
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::adjustInheritedFields(
    QPDFObjectHandle obj,
    bool override_da,
    std::string const& from_default_da,
    bool override_q,
    int from_default_q)
{
    // Override /Q or /DA if needed. If this object has a field type, directly or inherited, it is a
    // field and not just an annotation. In that case, we need to override if we are getting a value
    // from the document that is different from the value we would have gotten from the old
    // document. We must take care not to override an explicit value. It's possible that /FT may be
    // inherited by lower fields that may explicitly set /DA or /Q or that this is a field whose
    // type does not require /DA or /Q and we may be put a value on the field that is unused. This
    // is harmless, so it's not worth trying to work around.

    auto has_explicit = [](QPDFFormFieldObjectHelper& field, std::string const& key) {
        if (field.getObjectHandle().hasKey(key)) {
            return true;
        }
        auto oh = field.getInheritableFieldValue(key);
        if (!oh.isNull()) {
            return true;
        }
        return false;
    };

    if (override_da || override_q) {
        QPDFFormFieldObjectHelper cur_field(obj);
        if (override_da && (!has_explicit(cur_field, "/DA"))) {
            std::string da = cur_field.getDefaultAppearance();
            if (da != from_default_da) {
                QTC::TC("qpdf", "QPDFAcroFormDocumentHelper override da");
                obj.replaceKey("/DA", QPDFObjectHandle::newUnicodeString(from_default_da));
            }
        }
        if (override_q && (!has_explicit(cur_field, "/Q"))) {
            int q = cur_field.getQuadding();
            if (q != from_default_q) {
                QTC::TC("qpdf", "QPDFAcroFormDocumentHelper override q");
                obj.replaceKey("/Q", QPDFObjectHandle::newInteger(from_default_q));
            }
        }
    }
}